

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.h
# Opt level: O3

void __thiscall
absl::cord_internal::InlineData::set_inline_data(InlineData *this,char *data,size_t n)

{
  byte bVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long *plVar6;
  int iVar7;
  sbyte sVar8;
  sbyte sVar9;
  ulong uVar10;
  int iVar11;
  char *pcVar12;
  
  if (n < 0x10) {
    (this->rep_).field_0.data[0] = (char)n * '\x02';
    if (7 < n) {
      uVar4 = *(undefined8 *)data;
      uVar5 = *(undefined8 *)(data + (n - 8));
      (this->rep_).field_0.as_tree.rep = (CordRep *)0x0;
      *(undefined8 *)((long)&(this->rep_).field_0.as_tree.cordz_info + 1) = uVar4;
      *(undefined8 *)((long)this + (n - 7)) = uVar5;
      return;
    }
    if (3 < n) {
      uVar2 = *(undefined4 *)data;
      uVar3 = *(undefined4 *)(data + (n - 4));
      *(undefined4 *)((long)&(this->rep_).field_0 + 5) = 0;
      (this->rep_).field_0.as_tree.rep = (CordRep *)0x0;
      *(undefined4 *)((long)&(this->rep_).field_0 + 1) = uVar2;
      *(undefined4 *)((long)this + (n - 3)) = uVar3;
      return;
    }
    if (n != 0) {
      (this->rep_).field_0.data[1] = *data;
      (this->rep_).field_0.data[(n >> 1) + 1] = data[n >> 1];
      (this->rep_).field_0.data[n] = data[n - 1];
    }
    (this->rep_).field_0.as_tree.rep = (CordRep *)0x0;
    *(undefined8 *)((long)&(this->rep_).field_0 + n + 1) = 0;
    return;
  }
  set_inline_data();
  if ((((CordRepBtree *)this)->super_CordRep).refcount.count_.super___atomic_base<int>._M_i != 2) {
    __assert_fail("refcount.IsOne()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                  ,0x359,"Span<char> absl::cord_internal::CordRepBtree::GetAppendBuffer(size_t)");
  }
  uVar10 = (ulong)(((CordRepBtree *)this)->super_CordRep).storage[0];
  switch(uVar10) {
  case 0:
    goto switchD_001353f2_caseD_0;
  case 1:
    goto switchD_001353f2_caseD_1;
  case 2:
    goto switchD_001353f2_caseD_2;
  case 3:
    break;
  default:
    CordRepBtree::GetAppendBufferSlow((CordRepBtree *)this,(size_t)data);
    return;
  }
  this = *(InlineData **)
          ((((CordRepBtree *)this)->super_CordRep).storage +
          (ulong)(((CordRepBtree *)this)->super_CordRep).storage[2] * 8 + -5);
  if ((((CordRepBtree *)this)->super_CordRep).tag != '\x03') goto LAB_00135557;
  if ((((CordRepBtree *)this)->super_CordRep).refcount.count_.super___atomic_base<int>._M_i != 2) {
    return;
  }
switchD_001353f2_caseD_2:
  this = *(InlineData **)
          ((((CordRepBtree *)this)->super_CordRep).storage +
          (ulong)(((CordRepBtree *)this)->super_CordRep).storage[2] * 8 + -5);
  if ((((CordRepBtree *)this)->super_CordRep).tag == '\x03') {
    if ((((CordRepBtree *)this)->super_CordRep).refcount.count_.super___atomic_base<int>._M_i == 2)
    {
switchD_001353f2_caseD_1:
      this = *(InlineData **)
              ((((CordRepBtree *)this)->super_CordRep).storage +
              (ulong)(((CordRepBtree *)this)->super_CordRep).storage[2] * 8 + -5);
      if ((((CordRepBtree *)this)->super_CordRep).tag != '\x03') goto LAB_00135557;
      if ((((CordRepBtree *)this)->super_CordRep).refcount.count_.super___atomic_base<int>._M_i == 2
         ) {
switchD_001353f2_caseD_0:
        plVar6 = *(long **)((((CordRepBtree *)this)->super_CordRep).storage +
                           (ulong)(((CordRepBtree *)this)->super_CordRep).storage[2] * 8 + -5);
        if ((int)plVar6[1] == 2) {
          bVar1 = *(byte *)((long)plVar6 + 0xc);
          if (5 < bVar1) {
            if (0xf8 < bVar1) {
              __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                            ,0xb6,"CordRepFlat *absl::cord_internal::CordRep::flat()");
            }
            sVar9 = 0xc;
            if (bVar1 < 0xbb) {
              sVar9 = 6;
            }
            iVar11 = -0xb800d;
            if (bVar1 < 0xbb) {
              iVar11 = -0xe8d;
            }
            sVar8 = 3;
            if (0x42 < bVar1) {
              sVar8 = sVar9;
            }
            iVar7 = -0x1d;
            if (0x42 < bVar1) {
              iVar7 = iVar11;
            }
            pcVar12 = (char *)((long)(int)(((uint)bVar1 << sVar8) + iVar7) - *plVar6);
            if (pcVar12 != (char *)0x0) {
              if (pcVar12 < data) {
                data = pcVar12;
              }
              *plVar6 = (long)(data + *plVar6);
              (*(code *)(&DAT_0016c8b4 + *(int *)(&DAT_0016c8b4 + uVar10 * 4)))();
              return;
            }
          }
        }
      }
    }
    return;
  }
LAB_00135557:
  __assert_fail("IsBtree()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
}

Assistant:

void set_inline_data(const char* data, size_t n) {
    ABSL_ASSERT(n <= kMaxInline);
    unpoison();
    rep_.set_tag(static_cast<int8_t>(n << 1));
    SmallMemmove<true>(rep_.as_chars(), data, n);
    poison();
  }